

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O3

void cswap(int n,complex<float> *cx,int incx,complex<float> *cy,int incy)

{
  _ComplexT_conflict _Var1;
  complex<float> *pcVar2;
  ulong uVar3;
  complex<float> *pcVar4;
  
  if (0 < n) {
    if (incy != 1 || incx != 1) {
      pcVar4 = cx + (incx >> 0x1f & (1 - n) * incx);
      pcVar2 = cy + (incy >> 0x1f & (1 - n) * incy);
      do {
        _Var1 = pcVar4->_M_value;
        pcVar4->_M_value = pcVar2->_M_value;
        pcVar2->_M_value = _Var1;
        pcVar4 = pcVar4 + incx;
        pcVar2 = pcVar2 + incy;
        n = n + -1;
      } while (n != 0);
      return;
    }
    uVar3 = 0;
    do {
      _Var1 = cx[uVar3]._M_value;
      cx[uVar3]._M_value = cy[uVar3]._M_value;
      cy[uVar3]._M_value = _Var1;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  return;
}

Assistant:

void cswap ( int n, complex <float> cx[], int incx, complex <float> cy[],
  int incy )

//****************************************************************************80
//
//  Purpose:
//
//    CSWAP interchanges two vectors.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input/output, complex <float> CX[], one of the vectors to swap.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Input/output, complex <float> CY[], one of the vectors to swap.
//
//    Input, int INCY, the increment between successive elements of CY.
//
{
  complex <float> ctemp;
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      ctemp = cx[i];
      cx[i] = cy[i];
      cy[i] = ctemp;
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      ctemp = cx[ix];
      cx[ix] = cy[iy];
      cy[iy] = ctemp;
      ix = ix + incx;
      iy = iy + incy;
    }
  }

  return;
}